

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep_io.c
# Opt level: O0

int SPRKStepGetNumRhsEvals(void *arkode_mem,long *nf1,long *nf2)

{
  undefined8 in_RDX;
  int partition_index;
  void *in_RSI;
  int retval;
  uint in_stack_ffffffffffffffd8;
  int local_4;
  
  partition_index = (int)((ulong)in_RDX >> 0x20);
  local_4 = ARKodeGetNumRhsEvals(in_RSI,partition_index,(long *)(ulong)in_stack_ffffffffffffffd8);
  if ((local_4 == 0) &&
     (local_4 = ARKodeGetNumRhsEvals
                          (in_RSI,partition_index,(long *)(ulong)in_stack_ffffffffffffffd8),
     local_4 == 0)) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int SPRKStepGetNumRhsEvals(void* arkode_mem, long int* nf1, long int* nf2)
{
  int retval = ARK_SUCCESS;

  retval = ARKodeGetNumRhsEvals(arkode_mem, 0, nf1);
  if (retval != ARK_SUCCESS) { return retval; }

  retval = ARKodeGetNumRhsEvals(arkode_mem, 1, nf2);
  if (retval != ARK_SUCCESS) { return retval; }

  return ARK_SUCCESS;
}